

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

void try_call(ch_context *context,ch_primitive primitive,ch_argcount argcount)

{
  anon_union_8_4_dd993ae3_for_ch_primitive_1 function;
  ch_native *native;
  ch_closure *closure;
  ch_object *object;
  ch_argcount argcount_local;
  ch_context *context_local;
  ch_primitive primitive_local;
  
  function = primitive.field_1;
  if (primitive.type == PRIMITIVE_OBJECT) {
    if (((ch_object *)&(function.object_value)->type)->type == TYPE_CLOSURE) {
      call(context,*(ch_function **)(function.object_value + 2),argcount);
      (context->call_stack).calls[(context->call_stack).size - 1].closure = (ch_closure *)function;
    }
    else if (((ch_object *)&(function.object_value)->type)->type == TYPE_FUNCTION) {
      call(context,(ch_function *)function.object_value,argcount);
    }
    else if (((ch_object *)&(function.object_value)->type)->type == TYPE_NATIVE) {
      (*(code *)*(ch_function **)(function.object_value + 2))(context,argcount);
    }
    else {
      ch_runtime_error(context,EXIT_INCORRECT_TYPE,
                       "Attempted to invoke object type %d as a function.",
                       (ulong)((ch_object *)&(function.object_value)->type)->type);
    }
  }
  else {
    ch_runtime_error(context,EXIT_INCORRECT_TYPE,"Attempted to invoke type %d as a function.",
                     (ulong)primitive.type);
  }
  return;
}

Assistant:

static void try_call(ch_context *context, ch_primitive primitive,
                     ch_argcount argcount) {
  if (!IS_OBJECT(primitive)) {
    ch_runtime_error(context, EXIT_INCORRECT_TYPE,
                     "Attempted to invoke type %d as a function.",
                     primitive.type);
    return;
  }

  ch_object *object = AS_OBJECT(primitive);

  if (IS_CLOSURE(object)) {
    ch_closure* closure = AS_CLOSURE(object);
    call(context, closure->function, argcount);
    CURRENT_CALL(context).closure = closure;
    return;
  }

  if (IS_FUNCTION(object)) {
    call(context, AS_FUNCTION(object), argcount);
    return;
  }

  if (IS_NATIVE(object)) {
    ch_native *native = AS_NATIVE(object);
    native->function(context, argcount);
    return;
  }

  ch_runtime_error(context, EXIT_INCORRECT_TYPE,
                   "Attempted to invoke object type %d as a function.",
                   object->type);
}